

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__declare
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  URI *this_00;
  ParserChar *text;
  undefined8 uVar1;
  bool bVar2;
  byte *pbVar3;
  StringHash SVar4;
  uint64 uVar5;
  undefined4 uVar6;
  byte *pbVar7;
  xmlChar **ppxVar8;
  uint *puVar9;
  ulong uVar10;
  bool failed_2;
  ParserChar *attributeValue;
  bool failed;
  bool local_139;
  ParserChar *local_138;
  uint *local_130;
  byte *local_128;
  byte *local_120;
  URI local_118;
  
  pbVar3 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x118);
  uVar1 = declare__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)pbVar3 = declare__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(pbVar3 + 8) = uVar1;
  uVar1 = declare__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(pbVar3 + 0x10) = declare__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(pbVar3 + 0x18) = uVar1;
  uVar1 = declare__AttributeData::DEFAULT._40_8_;
  *(undefined8 *)(pbVar3 + 0x20) = declare__AttributeData::DEFAULT._32_8_;
  *(undefined8 *)(pbVar3 + 0x28) = uVar1;
  this_00 = (URI *)(pbVar3 + 0x30);
  COLLADABU::URI::URI(this_00,(URI *)(declare__AttributeData::DEFAULT + 0x30),false);
  *attributeDataPtr = pbVar3;
  ppxVar8 = attributes->attributes;
  if (ppxVar8 != (xmlChar **)0x0) {
    local_120 = pbVar3 + 0x28;
    local_128 = pbVar3 + 0x10;
    local_130 = &DAT_0085b4e8;
    do {
      text = *ppxVar8;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
        local_138 = ppxVar8[1];
        if ((long)SVar4 < 0x79a665) {
          pbVar7 = pbVar3 + 8;
          if (SVar4 == 0x7c065) goto LAB_0076e961;
          if (SVar4 == 0x593f0c) {
            GeneratedSaxParser::Utils::toURI(&local_118,&local_138,&local_139);
            COLLADABU::URI::operator=(this_00,&local_118);
            COLLADABU::URI::~URI(&local_118);
            if ((local_139 == true) &&
               (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0xaba28e5,0x593f0c,local_138),
               bVar2)) {
LAB_0076ea76:
              bVar2 = false;
              validationDataPtr = (void **)0x1;
            }
            else {
              validationDataPtr = (void **)0x4;
              bVar2 = true;
              if (local_139 == false) {
                *pbVar3 = *pbVar3 | 2;
              }
            }
          }
          else {
            if (SVar4 != 0x7488e3) goto LAB_0076e9fd;
            uVar5 = GeneratedSaxParser::Utils::toUint64(local_138,(bool *)&local_118);
            *(uint64 *)(pbVar3 + 0x18) = uVar5;
            if (((char)local_118.mUriString._M_dataplus._M_p == '\x01') &&
               (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0xaba28e5,0x7488e3,local_138),
               bVar2)) goto LAB_0076ea76;
            validationDataPtr = (void **)0x4;
            bVar2 = true;
            if ((char)local_118.mUriString._M_dataplus._M_p == '\0') {
              *pbVar3 = *pbVar3 | 1;
            }
          }
LAB_0076ea90:
          if (bVar2) goto LAB_0076ea95;
        }
        else {
          if (SVar4 == 0xc9ffd35) {
            SVar4 = GeneratedSaxParser::Utils::calculateStringHash(local_138,(bool *)&local_118);
            bVar2 = false;
            uVar10 = 0;
            puVar9 = local_130;
            do {
              if (*(StringHash *)(puVar9 + -2) == SVar4) {
                local_118.mUriString._M_dataplus._M_p._0_1_ = '\0';
                validationDataPtr = (void **)(ulong)*puVar9;
              }
              uVar6 = SUB84(validationDataPtr,0);
              if (*(StringHash *)(puVar9 + -2) == SVar4) break;
              bVar2 = 1 < uVar10;
              uVar10 = uVar10 + 1;
              puVar9 = puVar9 + 4;
            } while (uVar10 != 3);
            if (bVar2) {
              local_118.mUriString._M_dataplus._M_p._0_1_ = '\x01';
              uVar6 = 3;
            }
            *(undefined4 *)(pbVar3 + 0x20) = uVar6;
            if (((char)local_118.mUriString._M_dataplus._M_p == '\x01') &&
               (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0xaba28e5,0xc9ffd35,local_138),
               bVar2)) goto LAB_0076ea76;
            validationDataPtr = (void **)0x4;
            bVar2 = true;
            goto LAB_0076ea90;
          }
          pbVar7 = local_120;
          if ((SVar4 != 0x4a5aa87) && (pbVar7 = local_128, SVar4 != 0x79a665)) {
LAB_0076e9fd:
            bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_UNKNOWN_ATTRIBUTE,0xaba28e5,text,local_138);
            validationDataPtr = (void **)0x1;
            if (!bVar2) goto LAB_0076ea95;
            goto LAB_0076ea97;
          }
LAB_0076e961:
          *(ParserChar **)pbVar7 = local_138;
LAB_0076ea95:
          validationDataPtr = (void **)0x0;
        }
LAB_0076ea97:
        ppxVar8 = ppxVar8 + 2;
      }
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr != 3) {
      return false;
    }
  }
  if ((*pbVar3 & 2) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(this_00,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__declare( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__declare( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

declare__AttributeData* attributeData = newData<declare__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_TYPE:
    {

attributeData->type = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_SCOPE:
    {

attributeData->scope = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NARGS:
    {
bool failed;
attributeData->nargs = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DECLARE,
        HASH_ATTRIBUTE_NARGS,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= declare__AttributeData::ATTRIBUTE_NARGS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_OCCURRENCE:
    {
bool failed;
attributeData->occurrence = Utils::toEnum<ENUM__mathml__declare__occurrence, StringHash, ENUM__mathml__declare__occurrence__COUNT>(attributeValue, failed, ENUM__mathml__declare__occurrenceMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DECLARE,
        HASH_ATTRIBUTE_OCCURRENCE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_ENCODING:
    {

attributeData->encoding = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_DEFINITIONURL:
    {
bool failed;
attributeData->definitionURL = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DECLARE,
        HASH_ATTRIBUTE_DEFINITIONURL,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= declare__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_DECLARE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & declare__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT) == 0)
{
    attributeData->definitionURL = COLLADABU::URI("");
}


    return true;
}